

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

mz_bool tdefl_compress_mem_to_output
                  (void *pBuf,size_t buf_len,tdefl_put_buf_func_ptr pPut_buf_func,
                  void *pPut_buf_user,int flags)

{
  tdefl_status tVar1;
  tdefl_put_buf_func_ptr pPut_buf_func_00;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  undefined4 in_R8D;
  mz_bool succeeded;
  tdefl_compressor *pComp;
  tdefl_flush in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 local_4;
  
  if (((in_RSI == 0) || (in_RDI != 0)) && (in_RDX != 0)) {
    pPut_buf_func_00 = (tdefl_put_buf_func_ptr)malloc(0x4df78);
    if (pPut_buf_func_00 == (tdefl_put_buf_func_ptr)0x0) {
      local_4 = 0;
    }
    else {
      tVar1 = tdefl_init((tdefl_compressor *)CONCAT44(in_R8D,in_stack_ffffffffffffffd0),
                         pPut_buf_func_00,
                         (void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                         in_stack_ffffffffffffffbc);
      local_4 = 0;
      if (tVar1 == TDEFL_STATUS_OKAY) {
        tVar1 = tdefl_compress_buffer
                          ((tdefl_compressor *)CONCAT44(in_R8D,in_stack_ffffffffffffffd0),
                           pPut_buf_func_00,
                           (ulong)CONCAT14(tVar1 == TDEFL_STATUS_OKAY,in_stack_ffffffffffffffc0) &
                           0xffffffff00ffffff,in_stack_ffffffffffffffbc);
        local_4 = (uint)(tVar1 == TDEFL_STATUS_DONE) << 0x18;
      }
      local_4 = local_4 >> 0x18;
      free(pPut_buf_func_00);
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

mz_bool tdefl_compress_mem_to_output(const void *pBuf, size_t buf_len,
                                     tdefl_put_buf_func_ptr pPut_buf_func,
                                     void *pPut_buf_user, int flags) {
  tdefl_compressor *pComp;
  mz_bool succeeded;
  if (((buf_len) && (!pBuf)) || (!pPut_buf_func)) return MZ_FALSE;
  pComp = (tdefl_compressor *)MZ_MALLOC(sizeof(tdefl_compressor));
  if (!pComp) return MZ_FALSE;
  succeeded = (tdefl_init(pComp, pPut_buf_func, pPut_buf_user, flags) ==
               TDEFL_STATUS_OKAY);
  succeeded =
      succeeded && (tdefl_compress_buffer(pComp, pBuf, buf_len, TDEFL_FINISH) ==
                    TDEFL_STATUS_DONE);
  MZ_FREE(pComp);
  return succeeded;
}